

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void __thiscall UI::setStyle(UI *this,EStyle styleId)

{
  undefined8 uVar1;
  undefined8 uVar2;
  int in_ESI;
  long in_RDI;
  ImVec4 IVar3;
  ImGuiStyle *style;
  int in_stack_fffffffffffffbd0;
  int iVar4;
  undefined1 local_418 [8];
  ColorTheme *in_stack_fffffffffffffbf0;
  ImVec4 local_218;
  ImVec4 IStack_208;
  ImVec4 IStack_1f8;
  ImVec4 IStack_1e8;
  ImVec4 IStack_1d8;
  ImVec4 IStack_1c8;
  ImVec4 IStack_1b8;
  ImVec4 IStack_1a8;
  ImVec4 IStack_198;
  ImVec4 IStack_188;
  ImVec4 IStack_178;
  ImVec4 IStack_168;
  ImVec4 IStack_158;
  ImVec4 IStack_148;
  ImVec4 IStack_138;
  ImVec4 IStack_128;
  ImVec4 IStack_118;
  ImVec4 IStack_108;
  ImVec4 IStack_f8;
  ImVec4 IStack_e8;
  ImVec4 IStack_d8;
  ImVec4 IStack_c8;
  ImVec4 IStack_b8;
  ImVec4 IStack_a8;
  ImVec4 IStack_98;
  ImVec4 IStack_88;
  ImVec4 IStack_78;
  ImVec4 IStack_68;
  ImVec4 IStack_58;
  ImVec4 IStack_48;
  ImVec4 IStack_38;
  ImVec4 IStack_28;
  ImGuiStyle *local_18;
  int local_c;
  
  local_c = in_ESI;
  local_18 = ImGui::GetStyle();
  if (local_c == 0) {
    ImVec4::ImVec4(&local_218,0.745098,0.745098,0.745098,1.0);
    ImVec4::ImVec4(&IStack_208,1.0,1.0,1.0,1.0);
    ImVec4::ImVec4(&IStack_1f8,0.223529,0.07451,0.235294,1.0);
    ImVec4::ImVec4(&IStack_1e8,0.270588,0.270588,0.380392,1.0);
    ImVec4::ImVec4(&IStack_1d8,0.258824,0.588235,0.980392,1.0);
    ImVec4::ImVec4(&IStack_1c8,0.223529,0.07451,0.235294,1.0);
    ImVec4::ImVec4(&IStack_1b8,0.745098,0.745098,0.745098,1.0);
    ImVec4::ImVec4(&IStack_1a8,1.0,1.0,1.0,1.0);
    ImVec4::ImVec4(&IStack_198,1.0,1.0,1.0,1.0);
    ImVec4::ImVec4(&IStack_188,0.12549,0.12549,0.12549,1.0);
    ImVec4::ImVec4(&IStack_178,0.0,0.0,0.0,1.0);
    ImVec4::ImVec4(&IStack_168,0.831373,0.831373,0.831373,1.0);
    ImVec4::ImVec4(&IStack_158,1.0,1.0,1.0,1.0);
    ImVec4::ImVec4(&IStack_148,0.152941,0.152941,0.235294,1.0);
    ImVec4::ImVec4(&IStack_138,1.0,1.0,1.0,1.0);
    ImVec4::ImVec4(&IStack_128,1.0,1.0,1.0,1.0);
    ImVec4::ImVec4(&IStack_118,0.752941,0.0,0.0,1.0);
    ImVec4::ImVec4(&IStack_108,1.0,1.0,1.0,1.0);
    iVar4 = local_c;
    ImVec4::ImVec4(&IStack_f8,0.0,0.0,0.0,1.0);
    ImVec4::ImVec4(&IStack_e8,0.360784,0.360784,0.360784,1.0);
    ImVec4::ImVec4(&IStack_d8,0.94902,0.94902,0.94902,1.0);
    ImVec4::ImVec4(&IStack_c8,0.745098,0.745098,0.0,1.0);
    ImVec4::ImVec4(&IStack_b8,0.5,0.5,1.0,1.0);
    ImVec4::ImVec4(&IStack_a8,0.94902,0.94902,0.94902,1.0);
    ImVec4::ImVec4(&IStack_98,0.188235,0.360784,0.188235,1.0);
    ImVec4::ImVec4(&IStack_88,1.0,1.0,1.0,1.0);
    ImVec4::ImVec4(&IStack_78,0.188235,0.501961,0.188235,1.0);
    ImVec4::ImVec4(&IStack_68,0.188235,0.752941,0.188235,1.0);
    ImVec4::ImVec4(&IStack_58,0.0,0.0,0.0,1.0);
    ImVec4::ImVec4(&IStack_48,1.0,1.0,1.0,1.0);
    ImVec4::ImVec4(&IStack_38,0.0,1.0,0.0,1.0);
    ImVec4::ImVec4(&IStack_28,0.745098,0.745098,0.745098,1.0);
    memcpy((void *)(in_RDI + 0x7c),&local_218,0x200);
    local_c = iVar4;
  }
  else if (local_c == 1) {
    memset(local_418,0,0x200);
    ColorTheme::ColorTheme(in_stack_fffffffffffffbf0);
    memcpy((void *)(in_RDI + 0x7c),local_418,0x200);
  }
  uVar1 = *(undefined8 *)(in_RDI + 0x7c);
  uVar2 = *(undefined8 *)(in_RDI + 0x84);
  local_18->Colors[0].x = (float)(int)uVar1;
  local_18->Colors[0].y = (float)(int)((ulong)uVar1 >> 0x20);
  local_18->Colors[0].z = (float)(int)uVar2;
  local_18->Colors[0].w = (float)(int)((ulong)uVar2 >> 0x20);
  uVar1 = *(undefined8 *)(in_RDI + 0x9c);
  uVar2 = *(undefined8 *)(in_RDI + 0xa4);
  local_18->Colors[0x18].x = (float)(int)uVar1;
  local_18->Colors[0x18].y = (float)(int)((ulong)uVar1 >> 0x20);
  local_18->Colors[0x18].z = (float)(int)uVar2;
  local_18->Colors[0x18].w = (float)(int)((ulong)uVar2 >> 0x20);
  uVar1 = *(undefined8 *)(in_RDI + 0xac);
  uVar2 = *(undefined8 *)(in_RDI + 0xb4);
  local_18->Colors[0x19].x = (float)(int)uVar1;
  local_18->Colors[0x19].y = (float)(int)((ulong)uVar1 >> 0x20);
  local_18->Colors[0x19].z = (float)(int)uVar2;
  local_18->Colors[0x19].w = (float)(int)((ulong)uVar2 >> 0x20);
  uVar1 = *(undefined8 *)(in_RDI + 0xbc);
  uVar2 = *(undefined8 *)(in_RDI + 0xc4);
  local_18->Colors[0x1a].x = (float)(int)uVar1;
  local_18->Colors[0x1a].y = (float)(int)((ulong)uVar1 >> 0x20);
  local_18->Colors[0x1a].z = (float)(int)uVar2;
  local_18->Colors[0x1a].w = (float)(int)((ulong)uVar2 >> 0x20);
  uVar1 = *(undefined8 *)(in_RDI + 0x9c);
  uVar2 = *(undefined8 *)(in_RDI + 0xa4);
  local_18->Colors[0x15].x = (float)(int)uVar1;
  local_18->Colors[0x15].y = (float)(int)((ulong)uVar1 >> 0x20);
  local_18->Colors[0x15].z = (float)(int)uVar2;
  local_18->Colors[0x15].w = (float)(int)((ulong)uVar2 >> 0x20);
  uVar1 = *(undefined8 *)(in_RDI + 0xac);
  uVar2 = *(undefined8 *)(in_RDI + 0xb4);
  local_18->Colors[0x16].x = (float)(int)uVar1;
  local_18->Colors[0x16].y = (float)(int)((ulong)uVar1 >> 0x20);
  local_18->Colors[0x16].z = (float)(int)uVar2;
  local_18->Colors[0x16].w = (float)(int)((ulong)uVar2 >> 0x20);
  uVar1 = *(undefined8 *)(in_RDI + 0xbc);
  uVar2 = *(undefined8 *)(in_RDI + 0xc4);
  local_18->Colors[0x17].x = (float)(int)uVar1;
  local_18->Colors[0x17].y = (float)(int)((ulong)uVar1 >> 0x20);
  local_18->Colors[0x17].z = (float)(int)uVar2;
  local_18->Colors[0x17].w = (float)(int)((ulong)uVar2 >> 0x20);
  uVar1 = *(undefined8 *)(in_RDI + 300);
  uVar2 = *(undefined8 *)(in_RDI + 0x134);
  local_18->Colors[4].x = (float)(int)uVar1;
  local_18->Colors[4].y = (float)(int)((ulong)uVar1 >> 0x20);
  local_18->Colors[4].z = (float)(int)uVar2;
  local_18->Colors[4].w = (float)(int)((ulong)uVar2 >> 0x20);
  uVar1 = *(undefined8 *)(in_RDI + 0xbc);
  uVar2 = *(undefined8 *)(in_RDI + 0xc4);
  local_18->Colors[5].x = (float)(int)uVar1;
  local_18->Colors[5].y = (float)(int)((ulong)uVar1 >> 0x20);
  local_18->Colors[5].z = (float)(int)uVar2;
  local_18->Colors[5].w = (float)(int)((ulong)uVar2 >> 0x20);
  uVar1 = *(undefined8 *)(in_RDI + 0x9c);
  uVar2 = *(undefined8 *)(in_RDI + 0xa4);
  local_18->Colors[0x21].x = (float)(int)uVar1;
  local_18->Colors[0x21].y = (float)(int)((ulong)uVar1 >> 0x20);
  local_18->Colors[0x21].z = (float)(int)uVar2;
  local_18->Colors[0x21].w = (float)(int)((ulong)uVar2 >> 0x20);
  uVar1 = *(undefined8 *)(in_RDI + 0xac);
  uVar2 = *(undefined8 *)(in_RDI + 0xb4);
  local_18->Colors[0x22].x = (float)(int)uVar1;
  local_18->Colors[0x22].y = (float)(int)((ulong)uVar1 >> 0x20);
  local_18->Colors[0x22].z = (float)(int)uVar2;
  local_18->Colors[0x22].w = (float)(int)((ulong)uVar2 >> 0x20);
  uVar1 = *(undefined8 *)(in_RDI + 0xbc);
  uVar2 = *(undefined8 *)(in_RDI + 0xc4);
  local_18->Colors[0x23].x = (float)(int)uVar1;
  local_18->Colors[0x23].y = (float)(int)((ulong)uVar1 >> 0x20);
  local_18->Colors[0x23].z = (float)(int)uVar2;
  local_18->Colors[0x23].w = (float)(int)((ulong)uVar2 >> 0x20);
  IVar3 = toVec4(local_c,in_stack_fffffffffffffbd0,(int)((ulong)in_RDI >> 0x20),(int)in_RDI);
  local_18->Colors[0x34].x = (float)(int)IVar3._0_8_;
  local_18->Colors[0x34].y = (float)(int)((ulong)IVar3._0_8_ >> 0x20);
  local_18->Colors[0x34].z = (float)(int)IVar3._8_8_;
  local_18->Colors[0x34].w = (float)(int)((ulong)IVar3._8_8_ >> 0x20);
  return;
}

Assistant:

void UI::setStyle(EStyle styleId) {
    auto & style = ImGui::GetStyle();

    switch (styleId) {
        case EStyle_Default:
            colors = {
                .textFG             = { 0.745098, 0.745098, 0.745098, 1.000000 },
                .titleFG            = { 1.000000, 1.000000, 1.000000, 1.000000 },
                .itemBG             = { 0.223529, 0.074510, 0.235294, 1.000000 },
                .itemBGHovered      = { 0.270588, 0.270588, 0.380392, 1.000000 },
                .itemBGActive       = { 0.258824, 0.588235, 0.980392, 1.000000 },
                .leftPanelBG        = { 0.223529, 0.074510, 0.235294, 1.000000 },
                .leftPanelTextFG    = { 0.745098, 0.745098, 0.745098, 1.000000 },
                .leftPanelTitleFG   = { 1.000000, 1.000000, 1.000000, 1.000000 },
                .mainWindowBG       = { 1.000000, 1.000000, 1.000000, 1.000000 },
                .mainWindowTextFG   = { 0.125490, 0.125490, 0.125490, 1.000000 },
                .mainWindowTitleFG  = { 0.000000, 0.000000, 0.000000, 1.000000 },
                .popupBG            = { 0.831373, 0.831373, 0.831373, 1.000000 },
                .listHeaderFG       = { 1.000000, 1.000000, 1.000000, 1.000000 },
                .channelSelectedBG  = { 0.152941, 0.152941, 0.235294, 1.000000 },
                .channelActiveFG    = { 1.000000, 1.000000, 1.000000, 1.000000 },
                .channelMentionsFG  = { 1.000000, 1.000000, 1.000000, 1.000000 },
                .channelMentionsBG  = { 0.752941, 0.000000, 0.000000, 1.000000 },
                .userActiveFG       = { 1.000000, 1.000000, 1.000000, 1.000000 },
                .messageUser        = { 0.000000, 0.000000, 0.000000, 1.000000 },
                .messageTime        = { 0.360784, 0.360784, 0.360784, 1.000000 },
                .messageHovered     = { 0.949020, 0.949020, 0.949020, 1.000000 },
                .messageReact       = { 0.745098, 0.745098, 0.000000, 1.000000 },
                .messageReplies     = { 0.500000, 0.500000, 1.000000, 1.000000 },
                .inputBG            = { 0.949020, 0.949020, 0.949020, 1.000000 },
                .inputSendBG        = { 0.188235, 0.360784, 0.188235, 1.000000 },
                .inputSendFG        = { 1.000000, 1.000000, 1.000000, 1.000000 },
                .inputSendBGHovered = { 0.188235, 0.501961, 0.188235, 1.000000 },
                .inputSendBGActive  = { 0.188235, 0.752941, 0.188235, 1.000000 },
                .inputTooltip       = { 0.000000, 0.000000, 0.000000, 1.000000 },
                .buttonActiveFG     = { 1.000000, 1.000000, 1.000000, 1.000000 },
                .indicatorOnline    = { 0.000000, 1.000000, 0.000000, 1.000000 },
                .indicatorOffline   = { 0.745098, 0.745098, 0.745098, 1.000000 },
            };
            break;
        case EStyle_Dark:
            colors = ColorTheme();
            break;
    }

    style.Colors[ImGuiCol_Text]          = colors.textFG;
    style.Colors[ImGuiCol_Header]        = colors.itemBG;
    style.Colors[ImGuiCol_HeaderHovered] = colors.itemBGHovered;
    style.Colors[ImGuiCol_HeaderActive]  = colors.itemBGActive;
    style.Colors[ImGuiCol_Button]        = colors.itemBG;
    style.Colors[ImGuiCol_ButtonHovered] = colors.itemBGHovered;
    style.Colors[ImGuiCol_ButtonActive]  = colors.itemBGActive;
    style.Colors[ImGuiCol_PopupBg]       = colors.popupBG;
    style.Colors[ImGuiCol_Border]        = colors.itemBGActive;
    style.Colors[ImGuiCol_Tab]           = colors.itemBG;
    style.Colors[ImGuiCol_TabHovered]    = colors.itemBGHovered;
    style.Colors[ImGuiCol_TabActive]     = colors.itemBGActive;

    style.Colors[ImGuiCol_ModalWindowDimBg] = toVec4(0, 0, 0, 0);
}